

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
__thiscall
pstore::command_line::details::
parse_option_arguments<std::__cxx11::string*,std::__cxx11::ostringstream>
          (details *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first_arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last_arg,
          string *program_name,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  details *pdVar1;
  bool bVar2;
  details dVar3;
  bool bVar4;
  int iVar5;
  option **ppoVar6;
  ostream *poVar7;
  string *psVar8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  tVar9;
  sticky_bool<false> ok;
  maybe<pstore::command_line::option_*,_void> handler;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  string arg_name;
  undefined1 local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *local_158;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  maybe<pstore::command_line::option_*,_void> local_140;
  maybe<pstore::command_line::option_*,_void> local_130;
  maybe<pstore::command_line::option_*,_void> local_120;
  details *local_110;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_108;
  string local_d8 [32];
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_b8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108.storage_._8_8_ = 0;
  local_108.storage_._16_8_ = 0;
  local_108.valid_ = false;
  local_108._1_7_ = 0;
  local_108.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_108.storage_._24_8_ = 0;
  local_178._M_dataplus._M_p = (pointer)0x0;
  local_178._M_string_length = 0;
  local_179 = (details)0x1;
  local_178.field_2._8_8_ = errs;
  local_158 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)program_name;
  local_110 = this;
  for (; first_arg != last_arg; first_arg = first_arg + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)first_arg);
    maybe<pstore::command_line::option_*,_void>::maybe
              (&local_120,(maybe<pstore::command_line::option_*,_void> *)&local_178);
    bVar2 = handler_takes_argument(&local_120);
    if (local_120.valid_ == true) {
      local_120.valid_ = false;
    }
    if (bVar2) {
      maybe<pstore::command_line::option_*,_void>::maybe
                (&local_130,(maybe<pstore::command_line::option_*,_void> *)&local_178);
      dVar3 = (details)handler_set_value(&local_130,&local_50);
      if (local_179 == (details)0x1) {
        local_179 = dVar3;
      }
      if (local_130.valid_ == true) {
        local_130.valid_ = false;
      }
      if ((char)local_178._M_dataplus._M_p == '\x01') {
        local_178._M_dataplus._M_p = local_178._M_dataplus._M_p & 0xffffffffffffff00;
      }
      goto LAB_0012f70d;
    }
    bVar2 = std::operator==(&local_50,"--");
    if (bVar2) {
      first_arg = first_arg + 1;
      bVar2 = true;
    }
    else {
      bVar4 = argument_is_positional(&local_50);
      bVar2 = true;
      if (!bVar4) {
        bVar2 = starts_with(&local_50,"--");
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_70,(string *)&local_50);
          get_option_and_value
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                      *)&local_b8,&local_70);
          local_150 = &local_108;
          local_148 = &local_50;
          std::tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&>::operator=
                    ((tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&> *)
                     &local_150,
                     (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                      *)&local_b8);
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          ::~_Tuple_impl(&local_b8);
          std::__cxx11::string::~string((string *)&local_70);
          find_handler((maybe<pstore::command_line::option_*,_void> *)&local_b8,&local_50);
          maybe<pstore::command_line::option_*,_void>::operator=
                    ((maybe<pstore::command_line::option_*,_void> *)&local_178,
                     (maybe<pstore::command_line::option_*,_void> *)&local_b8);
          if ((char)local_178._M_dataplus._M_p == '\x01') {
            ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator->
                                ((maybe<pstore::command_line::option_*,_void> *)&local_178);
            iVar5 = (*(*ppoVar6)->_vptr_option[9])();
            if ((char)iVar5 == '\0') {
              maybe<pstore::command_line::option_*,_void>::maybe
                        (&local_140,(maybe<pstore::command_line::option_*,_void> *)&local_178);
              errs = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_178.field_2._8_8_;
              record_value_if_available<std::__cxx11::ostringstream>
                        ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)
                         &local_b8,(details *)&local_140,
                         (maybe<pstore::command_line::option_*,_void> *)&local_108,local_158,
                         (string *)local_178.field_2._8_8_,in_R9);
              local_150 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)&local_179;
              local_148 = &local_178;
              std::
              tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
              ::operator=((tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                           *)&local_150,
                          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)
                          &local_b8);
              if (local_140.valid_ == true) {
                local_140.valid_ = false;
              }
              goto LAB_0012f70d;
            }
          }
          report_unknown_option<std::__cxx11::ostringstream>
                    ((string *)local_158,&local_50,&local_108,
                     (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_178.field_2._8_8_);
          if (local_179 == (details)0x1) {
            local_179 = (details)0x0;
          }
        }
        else {
          std::__cxx11::string::string(local_d8,(string *)&local_50);
          process_single_dash<std::__cxx11::ostringstream>
                    ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)&local_b8,
                     (details *)local_d8,(string *)local_158,(string *)local_178.field_2._8_8_,errs)
          ;
          local_150 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)&local_179;
          local_148 = &local_178;
          std::
          tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
          ::operator=((tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                       *)&local_150,
                      (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)&local_b8)
          ;
          if (local_b8.
              super__Tuple_impl<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              .
              super__Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
              ._M_head_impl.storage_.__data[0] == '\x01') {
            local_b8.
            super__Tuple_impl<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
            .
            super__Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
            ._M_head_impl.storage_.__data[0] = '\0';
          }
          std::__cxx11::string::~string(local_d8);
        }
LAB_0012f70d:
        bVar2 = false;
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) break;
  }
  if ((char)local_178._M_dataplus._M_p == '\x01') {
    ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator->
                        ((maybe<pstore::command_line::option_*,_void> *)&local_178);
    iVar5 = (*(*ppoVar6)->_vptr_option[0xe])();
    if ((char)iVar5 != '\0') {
      poVar7 = std::operator<<((ostream *)local_178.field_2._8_8_,(string *)local_158);
      poVar7 = std::operator<<(poVar7,": Argument \'");
      ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator->
                          ((maybe<pstore::command_line::option_*,_void> *)&local_178);
      psVar8 = option::name_abi_cxx11_(*ppoVar6);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      std::operator<<(poVar7,"\' requires a value\n");
      if (local_179 == (details)0x1) {
        local_179 = (details)0x0;
      }
    }
  }
  pdVar1 = local_110;
  *local_110 = local_179;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_110 + 8) = first_arg
  ;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  reset(&local_108);
  tVar9.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = extraout_RDX._M_head_impl;
  tVar9.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  ._0_8_ = pdVar1;
  return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
          )tVar9.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  ;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }